

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

void amrex::anon_unknown_12::bldTable
               (char **str,
               list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *tab)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *plVar3;
  int iVar4;
  ostream *poVar5;
  _Node *p_Var6;
  byte *pbVar7;
  byte *pbVar8;
  byte bVar9;
  string tokname;
  string cur_name;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cur_list;
  Table cur_table;
  string tmp_str;
  string msg;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  string local_f0;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *local_b8;
  _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> local_b0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  PP_entry local_78;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_d0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d0;
  local_d0._M_impl._M_node._M_size = 0;
  local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
  local_b0._M_impl._M_node._M_size = 0;
  local_98 = &local_88;
  local_90 = 0;
  local_88 = 0;
  local_d0._M_impl._M_node.super__List_node_base._M_prev =
       local_d0._M_impl._M_node.super__List_node_base._M_next;
  local_b8 = tab;
  local_b0._M_impl._M_node.super__List_node_base._M_prev =
       local_b0._M_impl._M_node.super__List_node_base._M_next;
LAB_0041aeb9:
  local_110 = &local_100;
  local_108 = 0;
  local_100 = 0;
  pbVar7 = (byte *)*str;
  while( true ) {
    while (bVar9 = *pbVar7, bVar9 == 0x23) {
      while ((pbVar8 = pbVar7 + 1, bVar9 != 0 && (bVar9 != 10))) {
        *str = (char *)pbVar8;
        pbVar7 = pbVar8;
        bVar9 = *pbVar8;
      }
    }
    if (bVar9 == 0) goto LAB_0041b4be;
    iVar4 = isspace((int)(char)bVar9);
    if (iVar4 == 0) break;
    pbVar7 = pbVar7 + 1;
    *str = (char *)pbVar7;
  }
  if (bVar9 == 0) {
LAB_0041b4be:
    addDefn(&local_f0,
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d0,local_b8);
    if (local_110 != &local_100) {
      operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    std::__cxx11::
    _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::_M_clear
              (&local_b0);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  do {
    if (bVar9 == 0) {
      Error_host("ParmParse::getToken: EOF while parsing");
    }
    if (bVar9 < 0x28) {
      if (bVar9 != 0x22) goto LAB_0041b0d8;
      pbVar7 = (byte *)(*str + 1);
      *str = (char *)pbVar7;
    }
    else {
      if (bVar9 < 0x3d) {
        if (bVar9 == 0x28) {
          std::__cxx11::string::push_back((char)&local_110);
          pbVar7 = (byte *)(*str + 1);
          *str = (char *)pbVar7;
          goto LAB_0041b106;
        }
      }
      else {
        if (bVar9 == 0x7d) {
          *str = *str + 1;
          if ((local_f0._M_string_length != 0) &&
             (local_d0._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_d0
             )) {
            Abort_host("ParmParse::bldTable() defn with no list");
          }
          goto LAB_0041b4be;
        }
        if (bVar9 == 0x7b) {
          *str = *str + 1;
          if (local_f0._M_string_length == 0) {
            Abort_host("ParmParse::bldTabe() \'{\' with no blocknamne");
          }
          if (local_d0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_d0
             ) {
            std::__cxx11::string::_M_assign((string *)&local_98);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_d0,(iterator)local_d0._M_impl._M_node.super__List_node_base._M_prev
                      );
            addDefn(&local_f0,
                    (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_d0,local_b8);
            std::__cxx11::string::_M_assign((string *)&local_f0);
          }
          bldTable(str,(list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                        *)&local_b0);
          if (local_f0._M_string_length == 0) {
            std::__cxx11::
            _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
            _M_clear(&local_b0);
            local_b0._M_impl._M_node._M_size = 0;
            local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
            local_b0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b0;
          }
          else {
            if (local_b0._M_impl._M_node.super__List_node_base._M_next ==
                (_List_node_base *)&local_b0) {
              poVar5 = ErrorStream();
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"ParmParse::addTable(): no values for Table ",0x2b);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,local_f0._M_dataplus._M_p,local_f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              Abort_host((char *)0x0);
            }
            ParmParse::PP_entry::PP_entry
                      (&local_78,&local_f0,
                       (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                        *)&local_b0);
            plVar3 = local_b8;
            p_Var6 = std::__cxx11::
                     list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
                     _M_create_node<amrex::ParmParse::PP_entry>(local_b8,&local_78);
            std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
            psVar1 = &(plVar3->
                      super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            ParmParse::PP_entry::~PP_entry(&local_78);
            std::__cxx11::
            _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
            _M_clear(&local_b0);
            local_b0._M_impl._M_node._M_size = 0;
            paVar2 = &local_78.m_name.field_2;
            local_78.m_name._M_string_length = 0;
            local_78.m_name.field_2._M_local_buf[0] = '\0';
            local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
            local_b0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b0;
            local_78.m_name._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.m_name._M_dataplus._M_p != paVar2) {
              operator_delete(local_78.m_name._M_dataplus._M_p,
                              CONCAT71(local_78.m_name.field_2._M_allocated_capacity._1_7_,
                                       local_78.m_name.field_2._M_local_buf[0]) + 1);
            }
          }
          goto LAB_0041b1e3;
        }
        if (bVar9 == 0x3d) break;
      }
LAB_0041b0d8:
      isalpha((int)(char)bVar9);
      std::__cxx11::string::push_back((char)&local_110);
      pbVar7 = (byte *)(*str + 1);
      *str = (char *)pbVar7;
    }
LAB_0041b106:
    bVar9 = *pbVar7;
  } while( true );
  std::__cxx11::string::push_back((char)&local_110);
  *str = *str + 1;
  if (local_f0._M_string_length == 0) {
    Abort_host("ParmParse::bldTable() EQ with no current defn");
  }
  if (local_d0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_d0) {
    std::__cxx11::string::_M_assign((string *)&local_98);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d0,(iterator)local_d0._M_impl._M_node.super__List_node_base._M_prev);
    addDefn(&local_f0,
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d0,local_b8);
    std::__cxx11::string::_M_assign((string *)&local_f0);
  }
LAB_0041b1e3:
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  goto LAB_0041aeb9;
}

Assistant:

void
bldTable (const char*&                    str,
          std::list<ParmParse::PP_entry>& tab)
{
    std::string            cur_name;
    std::list<std::string> cur_list;
    ParmParse::Table       cur_table;
    std::string            tmp_str;

    for (;;)
    {
        std::string tokname;

        PType token = getToken(str,tokname);

        switch (token)
        {
        case pCloseBracket:
            if ( !cur_name.empty() && cur_list.empty() )
            {
                amrex::Abort("ParmParse::bldTable() defn with no list");
            }
            AMREX_FALLTHROUGH;
        case pEOF:
            addDefn(cur_name,cur_list,tab);
            return;
        case pOpenBracket:
            if ( cur_name.empty() )
            {
                amrex::Abort("ParmParse::bldTabe() '{' with no blocknamne");
            }
            if ( !cur_list.empty() )
            {
                tmp_str = cur_list.back();
                cur_list.pop_back();
                addDefn(cur_name, cur_list, tab);
                cur_name = tmp_str;
            }
            bldTable(str, cur_table);
            addTable(cur_name, cur_table, tab);
            break;
        case pEQ_sign:
            if ( cur_name.empty() )
            {
                amrex::Abort("ParmParse::bldTable() EQ with no current defn");
            }
            if ( !cur_list.empty() )
            {
                tmp_str = cur_list.back();
                cur_list.pop_back();
                addDefn(cur_name,cur_list,tab);
                cur_name = tmp_str;
            }
            //
            // Read one too far, remove last name on list.
            //
            break;
        case pDefn:
            if ( cur_name.empty() )
            {
                cur_name = tokname;
                break;
            }
            //
            // Otherwise, fall through, this may be a string.
            //
            AMREX_FALLTHROUGH;
        case pValue:
            if ( cur_name.empty() )
            {
                std::string msg("ParmParse::bldTable(): value with no defn: ");
                msg += tokname;
                amrex::Abort(msg.c_str());
            }
            cur_list.push_back(tokname);
            break;
        }
    }
}